

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_insert.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true> __thiscall
duckdb::PhysicalInsert::GetGlobalSinkState(PhysicalInsert *this,ClientContext *context)

{
  long lVar1;
  Catalog *this_00;
  CatalogTransaction transaction;
  SchemaCatalogEntry *pSVar2;
  type info;
  DuckTableEntry *args_2;
  ClientContext *in_RDX;
  optional_ptr<duckdb::TableCatalogEntry,_true> local_68;
  _func_int **local_60;
  CatalogTransaction local_58;
  
  lVar1._0_1_ = (context->config).enable_progress_bar;
  lVar1._1_1_ = (context->config).print_progress_bar;
  lVar1._2_2_ = *(undefined2 *)&(context->config).field_0x92;
  lVar1._4_4_ = (context->config).wait_time;
  if (lVar1 == 0) {
    local_68.ptr = (TableCatalogEntry *)(context->config).profiler_settings._M_h._M_buckets;
  }
  else {
    pSVar2 = optional_ptr<duckdb::SchemaCatalogEntry,_true>::operator->
                       ((optional_ptr<duckdb::SchemaCatalogEntry,_true> *)
                        &(context->config).system_progress_bar_disable_reason);
    this_00 = (pSVar2->super_InCatalogEntry).catalog;
    Catalog::GetCatalogTransaction(&local_58,this_00,in_RDX);
    pSVar2 = (SchemaCatalogEntry *)(context->config).system_progress_bar_disable_reason;
    info = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
           ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                        *)&(context->config).enable_progress_bar);
    transaction.context.ptr = local_58.context.ptr;
    transaction.db.ptr = local_58.db.ptr;
    transaction.transaction.ptr = local_58.transaction.ptr;
    transaction.transaction_id = local_58.transaction_id;
    transaction.start_time = local_58.start_time;
    local_68.ptr = (TableCatalogEntry *)Catalog::CreateTable(this_00,transaction,pSVar2,info);
    local_68.ptr = (TableCatalogEntry *)
                   optional_ptr<duckdb::CatalogEntry,_true>::operator->
                             ((optional_ptr<duckdb::CatalogEntry,_true> *)&local_68);
  }
  args_2 = (DuckTableEntry *)optional_ptr<duckdb::TableCatalogEntry,_true>::operator->(&local_68);
  make_uniq<duckdb::InsertGlobalState,duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::DuckTableEntry&>
            ((duckdb *)&local_60,in_RDX,
             (vector<duckdb::LogicalType,_true> *)&context->registered_state,args_2);
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = local_60;
  return (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)
         (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)this;
}

Assistant:

unique_ptr<GlobalSinkState> PhysicalInsert::GetGlobalSinkState(ClientContext &context) const {
	optional_ptr<TableCatalogEntry> table;
	if (info) {
		// CREATE TABLE AS
		D_ASSERT(!insert_table);
		auto &catalog = schema->catalog;
		table = &catalog.CreateTable(catalog.GetCatalogTransaction(context), *schema.get_mutable(), *info)
		             ->Cast<TableCatalogEntry>();
	} else {
		D_ASSERT(insert_table);
		D_ASSERT(insert_table->IsDuckTable());
		table = insert_table.get_mutable();
	}
	auto result = make_uniq<InsertGlobalState>(context, GetTypes(), table->Cast<DuckTableEntry>());
	return std::move(result);
}